

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
* __thiscall
AddrManImpl::Select(AddrManImpl *this,bool new_only,
                   unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
                   *networks)

{
  long lVar1;
  byte bVar2;
  char *in_RCX;
  byte in_DL;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_RSI;
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *addrRet;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock9;
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  *in_stack_00000070;
  bool in_stack_0000007f;
  AddrManImpl *in_stack_00000080;
  Mutex *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffbb;
  int in_stack_ffffffffffffffbc;
  AddrManImpl *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_DL & 1;
  MaybeCheckNotHeld(in_stack_ffffffffffffff98);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_RSI,(AnnotatedMixin<std::mutex> *)CONCAT17(bVar2,in_stack_ffffffffffffffd0),in_RCX,
             (char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
             (bool)in_stack_ffffffffffffffbb);
  Check(in_stack_ffffffffffffffc0);
  Select_(in_stack_00000080,in_stack_0000007f,in_stack_00000070);
  Check(in_stack_ffffffffffffffc0);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::pair<CAddress, NodeSeconds> AddrManImpl::Select(bool new_only, const std::unordered_set<Network>& networks) const
{
    LOCK(cs);
    Check();
    auto addrRet = Select_(new_only, networks);
    Check();
    return addrRet;
}